

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t helper_mvst(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  ulong uVar1;
  uint8_t byte;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint64_t vaddr;
  int size;
  ulong uVar6;
  int mmu_idx;
  uintptr_t unaff_retaddr;
  uint64_t *local_98;
  S390Access local_80;
  S390Access local_58;
  
  uVar2 = (env->psw).mask;
  mmu_idx = 3;
  if ((uVar2 >> 0x3a & 1) != 0) {
    switch((uint)(uVar2 >> 0x2e) & 3) {
    case 0:
      mmu_idx = 0;
      break;
    case 1:
      abort();
    case 2:
      mmu_idx = 1;
      break;
    case 3:
      mmu_idx = 2;
    }
  }
  vaddr = env->regs[(int)r1];
  if ((uVar2 >> 0x20 & 1) == 0) {
    uVar4 = 0x7fffffff;
    if (-1 < (int)uVar2) {
      uVar4 = 0xffffff;
    }
    vaddr = (uint64_t)((uint)vaddr & uVar4);
    local_98 = env->regs + (int)r2;
    if ((int)uVar2 < 0) {
      uVar2 = (ulong)((uint)*local_98 & 0x7fffffff);
    }
    else {
      uVar2 = (ulong)((uint)*local_98 & 0xffffff);
    }
  }
  else {
    local_98 = env->regs + (int)r2;
    uVar2 = *local_98;
  }
  uVar1 = env->regs[0];
  uVar6 = -(uVar2 | 0xfffffffffffff000);
  if (-(vaddr | 0xfffffffffffff000) < -(uVar2 | 0xfffffffffffff000)) {
    uVar6 = -(vaddr | 0xfffffffffffff000);
  }
  if ((uVar1 & 0xffffff00) == 0) {
    lVar3 = 0;
    size = (int)uVar6;
    access_prepare(&local_58,env,uVar2,size,MMU_DATA_LOAD,mmu_idx,unaff_retaddr);
    access_prepare(&local_80,env,vaddr,size,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
    do {
      byte = access_get_byte(env,&local_58,(int)lVar3,unaff_retaddr);
      access_set_byte(env,&local_80,(int)lVar3,byte,unaff_retaddr);
      if (byte == (uint8_t)uVar1) {
        uVar2 = (env->psw).mask;
        if ((uVar2 & 0x100000000) == 0) {
          uVar4 = 0x7fffffff;
          if (-1 < (int)uVar2) {
            uVar4 = 0xffffff;
          }
          *(uint *)(env->regs + (int)r1) = (uint)(vaddr + lVar3) & uVar4;
        }
        else {
          env->regs[(int)r1] = vaddr + lVar3;
        }
        return 1;
      }
      lVar3 = lVar3 + 1;
    } while (size != (int)lVar3);
    uVar5 = vaddr + uVar6;
    uVar1 = (env->psw).mask;
    if ((uVar1 & 0x100000000) == 0) {
      uVar4 = 0x7fffffff;
      if (-1 < (int)uVar1) {
        uVar4 = 0xffffff;
      }
      uVar5 = (ulong)((uint)uVar5 & uVar4) | env->regs[(int)r1] & 0xffffffff00000000;
    }
    env->regs[(int)r1] = uVar5;
    uVar1 = (env->psw).mask;
    if ((uVar1 & 0x100000000) == 0) {
      uVar4 = 0x7fffffff;
      if (-1 < (int)uVar1) {
        uVar4 = 0xffffff;
      }
      *local_98 = *local_98 & 0xffffffff00000000 | (ulong)((uint)(uVar6 + uVar2) & uVar4);
    }
    else {
      *local_98 = uVar6 + uVar2;
    }
    return 3;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

uint32_t HELPER(mvst)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    const uint64_t d = get_address(env, r1);
    const uint64_t s = get_address(env, r2);
    const uint8_t c = env->regs[0];
    const int len = MIN(-(d | TARGET_PAGE_MASK), -(s | TARGET_PAGE_MASK));
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int i;

    if (env->regs[0] & 0xffffff00ull) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    /*
     * Our access should not exceed single pages, as we must not report access
     * exceptions exceeding the actually copied range (which we don't know at
     * this point). We might over-indicate watchpoints within the pages
     * (if we ever care, we have to limit processing to a single byte).
     */
    srca = access_prepare(env, s, len, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, d, len, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < len; i++) {
        const uint8_t v = access_get_byte(env, &srca, i, ra);

        access_set_byte(env, &desta, i, v, ra);
        if (v == c) {
            set_address_zero(env, r1, d + i);
            return 1;
        }
    }
    set_address_zero(env, r1, d + len);
    set_address_zero(env, r2, s + len);
    return 3;
}